

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

fdb_kvs_handle * scan(storage_t *st,fdb_kvs_handle *reuse_kv)

{
  char *__s1;
  bool bVar1;
  fdb_file_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle *pfVar5;
  undefined4 extraout_var_00;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *fhandle;
  fdb_file_handle **ppfVar6;
  list *unaff_R15;
  long lVar7;
  fdb_doc *rdoc;
  fdb_iterator *it;
  fdb_kvs_handle *snap_kv;
  idx_prams_t params;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_f8;
  uint64_t uStackY_f0;
  fdb_kvs_handle **ppfStackY_e8;
  fdb_kvs_handle *pfStackY_e0;
  list *plStackY_d8;
  fdb_file_handle **ppfStackY_c8;
  fdb_file_handle *pfStackY_c0;
  fdb_kvs_handle *pfStackY_b8;
  fdb_file_handle **ppfStackY_b0;
  timeval tStackY_a8;
  fdb_kvs_handle *pfStackY_98;
  fdb_doc *local_60;
  fdb_iterator *local_58;
  fdb_kvs_handle *local_50;
  idx_prams_t local_48;
  timeval local_30;
  undefined4 extraout_var;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  local_60 = (fdb_doc *)0x0;
  gen_index_params(&local_48);
  if (reuse_kv != (fdb_kvs_handle *)0x0) {
    fVar3 = fdb_snapshot_open(reuse_kv,&local_50,0xffffffffffffffff);
    if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00109eec;
    scan_cold_1();
  }
  pfVar5 = st->index1;
  ptr_handle = &local_50;
  fVar3 = fdb_snapshot_open(pfVar5,ptr_handle,0xffffffffffffffff);
  if (fVar3 == FDB_RESULT_SUCCESS) {
LAB_00109eec:
    fVar3 = fdb_iterator_init(local_50,&local_58,&local_48,0xc,local_48.max,0xc,0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      do {
        fVar3 = fdb_iterator_get(local_58,&local_60);
        if (fVar3 == FDB_RESULT_SUCCESS) {
          __s1 = (char *)local_60->key;
          iVar4 = strcmp(__s1,local_48.min);
          if ((iVar4 < 0) || (iVar4 = strcmp(__s1,local_48.max), 0 < iVar4)) {
            scan_cold_3();
          }
          fdb_doc_free(local_60);
          local_60 = (fdb_doc *)0x0;
        }
        fVar3 = fdb_iterator_next(local_58);
      } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    }
    fdb_iterator_close(local_58);
    return local_50;
  }
  scan_cold_2();
  plStackY_d8 = (list *)0x109fd7;
  pfStackY_98 = reuse_kv;
  gettimeofday(&tStackY_a8,(__timezone_ptr_t)0x0);
  fhandle = *(fdb_file_handle **)&pfVar5->kvs_config;
  ppfVar6 = &pfStackY_c0;
  plStackY_d8 = (list *)0x109fe9;
  fVar3 = fdb_get_all_snap_markers
                    (fhandle,(fdb_snapshot_info_t **)ppfVar6,(uint64_t *)&ppfStackY_b0);
  pfVar2 = pfStackY_c0;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfStackY_c8 = ppfStackY_b0;
    if (ppfStackY_b0 == (fdb_file_handle **)0x0) {
      bVar1 = false;
    }
    else {
      ppfVar6 = (fdb_file_handle **)0x0;
      bVar1 = false;
      do {
        unaff_R15 = (&pfVar2->handles)[(long)ppfVar6 * 3];
        if (0 < (long)unaff_R15) {
          pfVar5 = (fdb_kvs_handle *)&(&pfVar2->cmp_func_list)[(long)ppfVar6 * 3]->tail;
          do {
            plStackY_d8 = (list *)0x10a037;
            iVar4 = strcmp((char *)pfVar5[-1].bub_ctx.handle,(char *)ptr_handle);
            if (iVar4 == 0) {
              pfStackY_b8 = *(fdb_kvs_handle **)&pfVar5->kvs_config;
              bVar1 = true;
              break;
            }
            pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).custom_cmp_param;
            unaff_R15 = (list *)((long)&unaff_R15[-1].tail + 7);
          } while (unaff_R15 != (list *)0x0);
        }
      } while ((!bVar1) &&
              (ppfVar6 = (fdb_file_handle **)((long)ppfVar6 + 1), ppfVar6 != ppfStackY_c8));
    }
    plStackY_d8 = (list *)0x10a074;
    ppfVar6 = ppfStackY_c8;
    fVar3 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStackY_c0,(uint64_t)ppfStackY_c8);
    fhandle = pfStackY_c0;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      if (bVar1) {
        return pfStackY_b8;
      }
      goto LAB_0010a09c;
    }
  }
  else {
    plStackY_d8 = (list *)0x10a097;
    last_snap_seqnum();
  }
  plStackY_d8 = (list *)0x10a09c;
  last_snap_seqnum();
LAB_0010a09c:
  plStackY_d8 = (list *)print_n_markers;
  last_snap_seqnum();
  ppfStackY_e8 = ptr_handle;
  pfStackY_e0 = pfVar5;
  plStackY_d8 = unaff_R15;
  fVar3 = fdb_get_all_snap_markers((fdb_file_handle *)fhandle->root,&pfStackY_f8,&uStackY_f0);
  pfVar5 = (fdb_kvs_handle *)CONCAT44(extraout_var,fVar3);
  if (ppfVar6 != (fdb_file_handle **)0x0) {
    lVar7 = 0x10;
    do {
      iVar4 = printf("marker:  %lu\n",
                     *(undefined8 *)(*(long *)((long)&pfStackY_f8->marker + lVar7) + 8));
      pfVar5 = (fdb_kvs_handle *)CONCAT44(extraout_var_00,iVar4);
      lVar7 = lVar7 + 0x18;
      ppfVar6 = (fdb_file_handle **)((long)ppfVar6 + -1);
    } while (ppfVar6 != (fdb_file_handle **)0x0);
  }
  return pfVar5;
}

Assistant:

fdb_kvs_handle * scan(storage_t *st, fdb_kvs_handle *reuse_kv)
{
    TEST_INIT();

    fdb_kvs_handle *snap_kv;
    idx_prams_t params;
    fdb_status status;
    fdb_iterator *it;
    fdb_doc *rdoc = NULL;

    // generate params
    gen_index_params(&params);

    // create new snapkv or reuse current
    if(reuse_kv){
        status = fdb_snapshot_open(reuse_kv, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_snapshot_open(st->index1, &snap_kv, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // iterate over snapkv
    status = fdb_iterator_init(snap_kv, &it, params.min, 12,
                               params.max, 12, FDB_ITR_NONE);
    if (status == FDB_RESULT_SUCCESS) {
        do {
            status = fdb_iterator_get(it, &rdoc);
            if (status == FDB_RESULT_SUCCESS){

                // make sure every doc is within requested range
                TEST_CHK(((strcmp((char *)rdoc->key,params.min) >= 0) &&
                       (strcmp((char *)rdoc->key, params.max) <= 0)));
                fdb_doc_free(rdoc);
                rdoc=NULL;
            }
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    }

    fdb_iterator_close(it);

    return snap_kv;
}